

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O0

int IDAInitBS(void *ida_mem,int which,IDAResFnBS resS,sunrealtype tB0,N_Vector yyB0,N_Vector ypB0)

{
  IDAadjMemRec *pIVar1;
  N_Vector p_Var2;
  N_Vector in_RCX;
  IDAResFnBS in_RDX;
  int in_ESI;
  IDAMem in_RDI;
  N_Vector in_R8;
  double in_XMM0_Qa;
  int flag;
  void *ida_memB;
  IDABMem IDAB_mem;
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;
  IDABMemRec *local_50;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x342,"IDAInitBS",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else if (in_RDI->ida_adjMallocDone == 0) {
    IDAProcessError(in_RDI,-0x65,0x34d,"IDAInitBS",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                    ,"Illegal attempt to call before calling IDAadjInit.");
    local_4 = -0x65;
  }
  else {
    pIVar1 = in_RDI->ida_adj_mem;
    if ((in_XMM0_Qa < pIVar1->ia_tinitial) ||
       (pIVar1->ia_tfinal <= in_XMM0_Qa && in_XMM0_Qa != pIVar1->ia_tfinal)) {
      IDAProcessError(in_RDI,-0x68,0x357,"IDAInitBS",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                      ,
                      "The initial time tB0 is outside the interval over which the forward problem was solved."
                     );
      local_4 = -0x68;
    }
    else if (pIVar1->ia_storeSensi == 0) {
      IDAProcessError(in_RDI,-0x16,0x360,"IDAInitBS",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                      ,
                      "At least one backward problem requires sensitivities, but they were not stored for interpolation."
                     );
      local_4 = -0x16;
    }
    else if (in_ESI < pIVar1->ia_nbckpbs) {
      for (local_50 = pIVar1->IDAB_mem;
          (local_50 != (IDABMemRec *)0x0 && (in_ESI != local_50->ida_index));
          local_50 = local_50->ida_next) {
      }
      local_4 = IDAInit((void *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),(IDAResFn)in_RDX,
                        in_XMM0_Qa,in_RCX,in_R8);
      if (local_4 == 0) {
        local_50->ida_res_withSensi = 1;
        local_50->ida_resS = in_RDX;
        local_50->ida_t0 = in_XMM0_Qa;
        p_Var2 = (N_Vector)N_VClone(in_RCX);
        local_50->ida_yy = p_Var2;
        p_Var2 = (N_Vector)N_VClone(in_R8);
        local_50->ida_yp = p_Var2;
        N_VScale(0x3ff0000000000000,in_RCX,local_50->ida_yy);
        N_VScale(0x3ff0000000000000,in_R8,local_50->ida_yp);
        local_4 = 0;
      }
    }
    else {
      IDAProcessError(in_RDI,-0x16,0x369,"IDAInitBS",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                      ,"Illegal value for which.");
      local_4 = -0x16;
    }
  }
  return local_4;
}

Assistant:

int IDAInitBS(void* ida_mem, int which, IDAResFnBS resS, sunrealtype tB0,
              N_Vector yyB0, N_Vector ypB0)
{
  IDAadjMem IDAADJ_mem;
  IDAMem IDA_mem;
  IDABMem IDAB_mem;
  void* ida_memB;
  int flag;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSGAM_NULL_IDAMEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(IDA_PROFILER);

  /* Is ASA initialized ? */
  if (IDA_mem->ida_adjMallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_ADJ, __LINE__, __func__, __FILE__,
                    MSGAM_NO_ADJ);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_NO_ADJ);
  }
  IDAADJ_mem = IDA_mem->ida_adj_mem;

  /* Check the initial time for this backward problem against the adjoint data. */
  if ((tB0 < IDAADJ_mem->ia_tinitial) || (tB0 > IDAADJ_mem->ia_tfinal))
  {
    IDAProcessError(IDA_mem, IDA_BAD_TB0, __LINE__, __func__, __FILE__,
                    MSGAM_BAD_TB0);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_BAD_TB0);
  }

  /* Were sensitivities active during the forward integration? */
  if (!IDAADJ_mem->ia_storeSensi)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSGAM_BAD_SENSI);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  /* Check the value of which */
  if (which >= IDAADJ_mem->ia_nbckpbs)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSGAM_BAD_WHICH);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  /* Find the IDABMem entry in the linked list corresponding to 'which'. */
  IDAB_mem = IDAADJ_mem->IDAB_mem;
  while (IDAB_mem != NULL)
  {
    if (which == IDAB_mem->ida_index) { break; }
    /* advance */
    IDAB_mem = IDAB_mem->ida_next;
  }

  /* Get the IDAMem corresponding to this backward problem. */
  ida_memB = (void*)IDAB_mem->IDA_mem;

  /* Allocate and set the IDAS object */
  flag = IDAInit(ida_memB, IDAAres, tB0, yyB0, ypB0);

  if (flag != IDA_SUCCESS)
  {
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (flag);
  }

  /* Copy residual function pointer in IDAB_mem. */
  IDAB_mem->ida_res_withSensi = SUNTRUE;
  IDAB_mem->ida_resS          = resS;

  /* Allocate space and initialize the yy and yp vectors. */
  IDAB_mem->ida_t0 = tB0;
  IDAB_mem->ida_yy = N_VClone(yyB0);
  IDAB_mem->ida_yp = N_VClone(ypB0);
  N_VScale(ONE, yyB0, IDAB_mem->ida_yy);
  N_VScale(ONE, ypB0, IDAB_mem->ida_yp);

  SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
  return (IDA_SUCCESS);
}